

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O1

string * __thiscall
cmExportTryCompileFileGenerator::FindTargets
          (string *__return_storage_ptr__,cmExportTryCompileFileGenerator *this,string *propName,
          cmGeneratorTarget *tgt,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer *pppcVar1;
  _Rb_tree_node_base *__v;
  iterator __position;
  auto_ptr<cmCompiledGeneratorExpression> this_00;
  char *pcVar2;
  string *target;
  cmLocalGenerator *pcVar3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  pair<std::_Rb_tree_iterator<const_cmGeneratorTarget_*>,_bool> pVar6;
  allocator local_8d9;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  string local_8c8;
  cmGeneratorExpression ge;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget gDummyHead;
  cmTarget dummyHead;
  
  pcVar2 = cmGeneratorTarget::GetProperty(tgt,propName);
  if (pcVar2 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&gDummyHead);
    cmGeneratorExpression::cmGeneratorExpression(&ge,(cmListFileBacktrace *)&gDummyHead);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&gDummyHead);
    target = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,target,propName,(GeneratorExpressionContent *)0x0,
               (cmGeneratorExpressionDAGChecker *)0x0);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)&gDummyHead,(char *)&ge);
    cge.x_ = (cmCompiledGeneratorExpression *)gDummyHead.Target;
    gDummyHead.Target = (cmTarget *)0x0;
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&gDummyHead);
    gDummyHead.Target = (cmTarget *)&gDummyHead.LocalGenerator;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&gDummyHead,"try_compile_dummy_exe","");
    cmTarget::cmTarget(&dummyHead,(string *)&gDummyHead,EXECUTABLE,VisibilityNormal,
                       tgt->Target->Makefile);
    if (gDummyHead.Target != (cmTarget *)&gDummyHead.LocalGenerator) {
      operator_delete(gDummyHead.Target,
                      (ulong)((long)&(gDummyHead.LocalGenerator)->_vptr_cmLocalGenerator + 1));
    }
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(tgt);
    cmGeneratorTarget::cmGeneratorTarget(&gDummyHead,&dummyHead,pcVar3);
    this_00 = cge;
    pcVar3 = cmGeneratorTarget::GetLocalGenerator(tgt);
    local_8c8._M_string_length = 0;
    local_8c8.field_2._M_local_buf[0] = '\0';
    local_8c8._M_dataplus._M_p = (pointer)&local_8c8.field_2;
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       (this_00.x_,pcVar3,&this->Config,false,&gDummyHead,tgt,&dagChecker,&local_8c8
                       );
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,&local_8d9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8c8._M_dataplus._M_p != &local_8c8.field_2) {
      operator_delete(local_8c8._M_dataplus._M_p,
                      CONCAT71(local_8c8.field_2._M_allocated_capacity._1_7_,
                               local_8c8.field_2._M_local_buf[0]) + 1);
    }
    p_Var4 = ((cge.x_)->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var5 = &((cge.x_)->AllTargetsSeen)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var5) {
      do {
        __v = p_Var4 + 1;
        pVar6 = std::
                _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                ::_M_insert_unique<cmGeneratorTarget_const*const&>
                          ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                            *)emitted,(cmGeneratorTarget **)__v);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          __position._M_current =
               (this->Exports).
               super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this->Exports).
              super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>>::
            _M_realloc_insert<cmGeneratorTarget_const*const&>
                      ((vector<cmGeneratorTarget_const*,std::allocator<cmGeneratorTarget_const*>> *)
                       &this->Exports,__position,(cmGeneratorTarget **)__v);
          }
          else {
            *__position._M_current = *(cmGeneratorTarget **)__v;
            pppcVar1 = &(this->Exports).
                        super__Vector_base<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            *pppcVar1 = *pppcVar1 + 1;
          }
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var5);
    }
    cmGeneratorTarget::~cmGeneratorTarget(&gDummyHead);
    cmTarget::~cmTarget(&dummyHead);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
    cmListFileBacktrace::~cmListFileBacktrace(&dagChecker.Backtrace);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Target._M_dataplus._M_p != &dagChecker.Target.field_2) {
      operator_delete(dagChecker.Target._M_dataplus._M_p,
                      dagChecker.Target.field_2._M_allocated_capacity + 1);
    }
    cmGeneratorExpression::~cmGeneratorExpression(&ge);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportTryCompileFileGenerator::FindTargets(
  const std::string& propName, cmGeneratorTarget const* tgt,
  std::set<cmGeneratorTarget const*>& emitted)
{
  const char* prop = tgt->GetProperty(propName);
  if (!prop) {
    return std::string();
  }

  cmGeneratorExpression ge;

  cmGeneratorExpressionDAGChecker dagChecker(tgt->GetName(), propName,
                                             CM_NULLPTR, CM_NULLPTR);

  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(prop);

  cmTarget dummyHead("try_compile_dummy_exe", cmStateEnums::EXECUTABLE,
                     cmTarget::VisibilityNormal, tgt->Target->GetMakefile());

  cmGeneratorTarget gDummyHead(&dummyHead, tgt->GetLocalGenerator());

  std::string result = cge->Evaluate(tgt->GetLocalGenerator(), this->Config,
                                     false, &gDummyHead, tgt, &dagChecker);

  const std::set<cmGeneratorTarget const*>& allTargets =
    cge->GetAllTargetsSeen();
  for (std::set<cmGeneratorTarget const*>::const_iterator li =
         allTargets.begin();
       li != allTargets.end(); ++li) {
    if (emitted.insert(*li).second) {
      this->Exports.push_back(*li);
    }
  }
  return result;
}